

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_test.cpp
# Opt level: O2

void flatbuffers::tests::RunTest
               (IDLOptions *opts,string *proto_path,string *proto_file,string *golden_file,
               string *import_proto_file)

{
  long *plVar1;
  bool bVar2;
  Status SVar3;
  pointer *__ptr;
  long *local_1778;
  string *local_1770;
  string imported_fbs;
  char *include_directories [2];
  string fbs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1710;
  string import_fbs;
  string local_16d0;
  Parser import_parser;
  Parser parser2;
  Parser parser;
  
  include_directories[0] = (proto_path->_M_dataplus)._M_p;
  include_directories[1] = (char *)0x0;
  local_1770 = golden_file;
  Parser::Parser(&parser,opts);
  bVar2 = Parser::Parse(&parser,(proto_file->_M_dataplus)._M_p,include_directories,(char *)0x0);
  TestEq<bool,bool>(bVar2,true,
                    "\'parser.Parse(proto_file.c_str(), include_directories)\' != \'true\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/proto_test.cpp"
                    ,0x11,"");
  NewFBSCodeGenerator((flatbuffers *)&local_1778,true);
  plVar1 = local_1778;
  fbs._M_dataplus._M_p = (pointer)&fbs.field_2;
  fbs._M_string_length = 0;
  fbs.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&parser2,"test",(allocator<char> *)&import_parser);
  SVar3 = (**(code **)(*plVar1 + 0x18))(plVar1,&parser,&parser2,&fbs);
  TestEq<flatbuffers::CodeGenerator::Status,flatbuffers::CodeGenerator::Status>
            (SVar3,OK,
             "\'fbs_generator->GenerateCodeString(parser, \"test\", fbs)\' != \'CodeGenerator::Status::OK\'"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/proto_test.cpp"
             ,0x17,"");
  std::__cxx11::string::~string((string *)&parser2);
  IDLOptions::IDLOptions((IDLOptions *)&import_parser);
  Parser::Parser(&parser2,(IDLOptions *)&import_parser);
  IDLOptions::~IDLOptions((IDLOptions *)&import_parser);
  if (import_proto_file->_M_string_length != 0) {
    Parser::Parser(&import_parser,opts);
    bVar2 = Parser::Parse(&import_parser,(import_proto_file->_M_dataplus)._M_p,include_directories,
                          (char *)0x0);
    TestEq<bool,bool>(bVar2,true,
                      "\'import_parser.Parse(import_proto_file.c_str(), include_directories)\' != \'true\'"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/proto_test.cpp"
                      ,0x20,"");
    plVar1 = local_1778;
    import_fbs._M_dataplus._M_p = (pointer)&import_fbs.field_2;
    import_fbs._M_string_length = 0;
    import_fbs.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&imported_fbs,"test",(allocator<char> *)&local_1710);
    SVar3 = (**(code **)(*plVar1 + 0x18))(plVar1,&import_parser,&imported_fbs,&import_fbs);
    TestEq<flatbuffers::CodeGenerator::Status,flatbuffers::CodeGenerator::Status>
              (SVar3,OK,
               "\'fbs_generator->GenerateCodeString(import_parser, \"test\", import_fbs)\' != \'CodeGenerator::Status::OK\'"
               ,
               "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/proto_test.cpp"
               ,0x24,"");
    std::__cxx11::string::~string((string *)&imported_fbs);
    AbsolutePath(&local_16d0,proto_path);
    std::operator+(&local_1710,&local_16d0,"/imported.fbs");
    PosixPath(&imported_fbs,&local_1710);
    std::__cxx11::string::~string((string *)&local_1710);
    std::__cxx11::string::~string((string *)&local_16d0);
    bVar2 = Parser::Parse(&parser2,import_fbs._M_dataplus._M_p,include_directories,
                          imported_fbs._M_dataplus._M_p);
    TestEq<bool,bool>(bVar2,true,
                      "\'parser2.Parse(import_fbs.c_str(), include_directories, imported_fbs.c_str())\' != \'true\'"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/proto_test.cpp"
                      ,0x2c,"");
    std::__cxx11::string::~string((string *)&imported_fbs);
    std::__cxx11::string::~string((string *)&import_fbs);
    Parser::~Parser(&import_parser);
  }
  bVar2 = Parser::Parse(&parser2,fbs._M_dataplus._M_p,(char **)0x0,(char *)0x0);
  TestEq<bool,bool>(bVar2,true,"\'parser2.Parse(fbs.c_str(), nullptr)\' != \'true\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/proto_test.cpp"
                    ,0x2f,"");
  TestEqStr(fbs._M_dataplus._M_p,(local_1770->_M_dataplus)._M_p,
            "\'fbs.c_str()\' != \'golden_file.c_str()\'",
            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/proto_test.cpp"
            ,0x30,"");
  Parser::~Parser(&parser2);
  std::__cxx11::string::~string((string *)&fbs);
  if (local_1778 != (long *)0x0) {
    (**(code **)(*local_1778 + 8))();
  }
  Parser::~Parser(&parser);
  return;
}

Assistant:

void RunTest(const flatbuffers::IDLOptions &opts, const std::string &proto_path,
             const std::string &proto_file, const std::string &golden_file,
             const std::string import_proto_file) {
  const char *include_directories[] = { proto_path.c_str(), nullptr };

  // Parse proto.
  flatbuffers::Parser parser(opts);
  TEST_EQ(parser.Parse(proto_file.c_str(), include_directories), true);

  // Generate fbs.
  std::unique_ptr<CodeGenerator> fbs_generator = NewFBSCodeGenerator(true);
  std::string fbs;
  TEST_EQ(fbs_generator->GenerateCodeString(parser, "test", fbs),
          CodeGenerator::Status::OK);

  // Ensure generated file is parsable.
  flatbuffers::Parser parser2;

  if (!import_proto_file.empty()) {
    // Generate fbs from import.proto
    flatbuffers::Parser import_parser(opts);
    TEST_EQ(import_parser.Parse(import_proto_file.c_str(), include_directories),
            true);
    std::string import_fbs;
    TEST_EQ(
        fbs_generator->GenerateCodeString(import_parser, "test", import_fbs),
        CodeGenerator::Status::OK);
    // auto import_fbs = flatbuffers::GenerateFBS(import_parser, "test", true);
    // Since `imported.fbs` isn't in the filesystem AbsolutePath can't figure it
    // out by itself. We manually construct it so Parser works.
    std::string imported_fbs = flatbuffers::PosixPath(
        flatbuffers::AbsolutePath(proto_path) + "/imported.fbs");
    TEST_EQ(parser2.Parse(import_fbs.c_str(), include_directories,
                          imported_fbs.c_str()),
            true);
  }

  TEST_EQ(parser2.Parse(fbs.c_str(), nullptr), true);
  TEST_EQ_STR(fbs.c_str(), golden_file.c_str());
}